

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
pod_vector<IsoSpec::ProbAndConfPtr>::fast_reserve
          (pod_vector<IsoSpec::ProbAndConfPtr> *this,size_t n)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  bad_alloc *this_00;
  long in_RSI;
  undefined8 *in_RDI;
  ProbAndConfPtr *new_store;
  ptrdiff_t store_used_size;
  
  lVar1 = in_RDI[1];
  lVar2 = in_RDI[2];
  pvVar3 = realloc((void *)in_RDI[2],in_RSI << 4);
  if (pvVar3 != (void *)0x0) {
    in_RDI[1] = (void *)((long)pvVar3 + (lVar1 - lVar2 >> 4) * 0x10);
    *in_RDI = (void *)((long)pvVar3 + in_RSI * 0x10);
    in_RDI[2] = pvVar3;
    return;
  }
  this_00 = (bad_alloc *)__cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(this_00);
  __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void fast_reserve(size_t n)
    {
        ISOSPEC_IMPOSSIBLE(n < static_cast<size_t>(backend_past_end - store));
        const std::ptrdiff_t store_used_size = first_free - store;
        T* new_store = reinterpret_cast<T*>(realloc(store, n * sizeof(T)));
        if(new_store == NULL)
            throw std::bad_alloc();
        first_free = new_store + store_used_size;
        backend_past_end = new_store + n;
        store = new_store;
    }